

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O1

void __thiscall CTcStrTemplate::append_tok(CTcStrTemplate *this,CTcToken *tok)

{
  CTcTokenEle *dst;
  CTcStrTemplate *pCVar1;
  
  dst = (CTcTokenEle *)CTcPrsMem::alloc(G_prsmem,0x38);
  dst->nxt_ = (CTcTokenEle *)0x0;
  dst->prv_ = (CTcTokenEle *)0x0;
  CTcTokenizer::copytok(G_tok,(CTcToken *)dst,tok);
  pCVar1 = (CTcStrTemplate *)&this->tail->nxt_;
  if (this->tail == (CTcTokenEle *)0x0) {
    pCVar1 = this;
  }
  pCVar1->head = dst;
  this->tail = dst;
  this->cnt = this->cnt + 1;
  return;
}

Assistant:

void CTcStrTemplate::append_tok(const CTcToken *tok)
{
    /* create a new list element for the token */
    CTcTokenEle *ele = new (G_prsmem)CTcTokenEle();
    G_tok->copytok(ele, tok);

    /* add it to the tail of the list */
    if (tail != 0)
        tail->setnxt(ele);
    else
        head = ele;
    tail = ele;

    /* count the token */
    cnt++;
}